

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesPerformanceFactorSetConfig(zes_perf_handle_t hPerf,double factor)

{
  zes_pfnPerformanceFactorSetConfig_t pfnSetConfig;
  ze_result_t result;
  double factor_local;
  zes_perf_handle_t hPerf_local;
  
  pfnSetConfig._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cbc8 != (code *)0x0) {
    pfnSetConfig._4_4_ = (*DAT_0011cbc8)(factor,hPerf);
  }
  return pfnSetConfig._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPerformanceFactorSetConfig(
        zes_perf_handle_t hPerf,                        ///< [in] Handle for the Performance Factor domain.
        double factor                                   ///< [in] The new Performance Factor.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetConfig = context.zesDdiTable.PerformanceFactor.pfnSetConfig;
        if( nullptr != pfnSetConfig )
        {
            result = pfnSetConfig( hPerf, factor );
        }
        else
        {
            // generic implementation
        }

        return result;
    }